

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.cpp
# Opt level: O1

void __thiscall
TPZMatrixSolver<float>::TPZMatrixSolver
          (TPZMatrixSolver<float> *this,void **vtt,TPZAutoPointer<TPZMatrix<float>_> *Refmat)

{
  TPZReference *pTVar1;
  
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[2];
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  pTVar1 = (TPZReference *)operator_new(0x10);
  pTVar1->fPointer = (TPZMatrix<float> *)0x0;
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fReferenceMatrix).fRef = pTVar1;
  (this->fScratch).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  (this->fScratch).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  (this->fScratch).super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fScratch).super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fScratch).super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  (this->fScratch).fElem = (float *)0x0;
  (this->fScratch).fGiven = (float *)0x0;
  (this->fScratch).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fScratch).fPivot.super_TPZVec<int>,0);
  (this->fScratch).fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8
  ;
  (this->fScratch).fPivot.super_TPZVec<int>.fStore = (this->fScratch).fPivot.fExtAlloc;
  (this->fScratch).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fScratch).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fScratch).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  (this->fScratch).fWork.fStore = (float *)0x0;
  (this->fScratch).fWork.fNElements = 0;
  (this->fScratch).fWork.fNAlloc = 0;
  pTVar1 = (TPZReference *)operator_new(0x10);
  pTVar1->fPointer = (TPZMatrix<float> *)0x0;
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fContainer).fRef = pTVar1;
  TPZAutoPointer<TPZMatrix<float>_>::operator=(&this->fContainer,Refmat);
  return;
}

Assistant:

TPZMatrixSolver<TVar>::TPZMatrixSolver(TPZAutoPointer<TPZMatrix<TVar> > Refmat) :
fScratch()
{
	fContainer = Refmat;
}